

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_struct::translate
          (method_struct *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  int iVar2;
  const_reference pptVar3;
  token_base **pptVar4;
  undefined8 uVar5;
  var_id *this_00;
  string *psVar6;
  element_type *__first;
  size_type sVar7;
  statement_base *psVar8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_01;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  string name;
  tree_type<cs::token_base_*> *t;
  _Self *in_stack_fffffffffffffc68;
  compiler_type *in_stack_fffffffffffffc70;
  _Self *in_stack_fffffffffffffc78;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffc80;
  statement_function *in_stack_fffffffffffffcb0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffcc0;
  allocator_type *in_stack_fffffffffffffcd8;
  allocator *paVar9;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *this_02;
  tree_type<cs::token_base_*> in_stack_fffffffffffffd38;
  tree_type<cs::token_base_*> ptr_00;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffd48;
  tree_type<cs::token_base_*> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  statement_struct *in_stack_fffffffffffffd60;
  allocator local_239;
  string local_238 [32];
  reference local_218;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_1f0;
  undefined1 *local_1d0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_1a0;
  undefined1 local_110 [80];
  tree_node *local_c0;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  tree_node *local_70;
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  tree_node *local_30;
  tree_type<cs::token_base_*> *local_28;
  statement_base *local_8;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffc80);
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
  local_28 = token_expr::get_tree((token_expr *)*pptVar3);
  local_30 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc68);
  pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffcb0);
  if (*pptVar4 == (token_base *)0x0) {
    local_65 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Null pointer accessed.",&local_51);
    internal_error::internal_error
              ((internal_error *)in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68);
    local_65 = 0;
    __cxa_throw(uVar5,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_70 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc68);
  pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffcb0);
  iVar2 = (*(*pptVar4)->_vptr_token_base[2])();
  if (iVar2 == 4) {
    local_c0 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffc68);
    pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffffcb0);
    this_00 = token_id::get_id((token_id *)*pptVar4);
    psVar6 = var_id::operator_cast_to_string_(this_00);
    std::__cxx11::string::string(local_b8,(string *)psVar6);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x254e10);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x254e1f);
    __first = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x254e27);
    this_02 = &local_1a0;
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_fffffffffffffc68);
    std::operator+(in_stack_fffffffffffffc78,(difference_type)in_stack_fffffffffffffc70);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffc68);
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x254ea0);
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              (this_02,(_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                        *)__first,
               (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               in_stack_fffffffffffffcd8);
    compiler_type::translate
              (in_stack_fffffffffffffc70,
               (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)in_stack_fffffffffffffc68,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x254ee4);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffcc0);
    std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
              ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
               0x254f00);
    local_1d0 = local_110;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffc68);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffc68);
    do {
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      if (!bVar1) {
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffc80);
        sVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                          ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x2553b1);
        if (sVar7 == 5) {
          psVar8 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffc70)
          ;
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffc80);
          pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                               in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68);
          this_01 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                    token_expr::get_tree((token_expr *)*pptVar3);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)this_01);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_01);
          statement_struct::statement_struct
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd48,
                     (context_t *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (token_base *)in_stack_fffffffffffffd38.mRoot);
          local_8 = psVar8;
        }
        else {
          psVar8 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffc70)
          ;
          ptr_00.mRoot = (tree_node *)0x0;
          tree_type<cs::token_base_*>::tree_type
                    ((tree_type<cs::token_base_*> *)&stack0xfffffffffffffd38);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffffc80);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                    (in_stack_fffffffffffffc80);
          statement_struct::statement_struct
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd48,
                     (context_t *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (token_base *)ptr_00.mRoot);
          local_8 = psVar8;
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x255545);
        }
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  (in_stack_fffffffffffffcc0);
        std::__cxx11::string::~string(local_b8);
        return local_8;
      }
      local_218 = std::
                  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                  ::operator*(&local_1f0);
      iVar2 = (*(*local_218)->_vptr_statement_base[2])();
      if (iVar2 != 7) {
        if (iVar2 != 0x17) {
          uVar5 = __cxa_allocate_exception(0x28);
          paVar9 = &local_239;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_238,"Unexpected statement in structure definition.",paVar9);
          compile_error::compile_error
                    ((compile_error *)in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68)
          ;
          __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
        }
        statement_function::set_mem_fn(in_stack_fffffffffffffcb0);
      }
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                  *)in_stack_fffffffffffffc70);
    } while( true );
  }
  local_92 = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"Wrong grammar for struct definition, expect <id>",&local_91);
  compile_error::compile_error
            ((compile_error *)in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68);
  local_92 = 0;
  __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_struct::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for struct definition, expect <id>");
		std::string name = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			try {
				switch (ptr->get_type()) {
				default:
					throw compile_error("Unexpected statement in structure definition.");
				case statement_types::var_:
					break;
				case statement_types::function_:
					static_cast<statement_function *>(ptr)->set_mem_fn();
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		if (raw.front().size() == 5)
			return new statement_struct(name, static_cast<token_expr *>(raw.front().at(3))->get_tree(), body, context,
			                            raw.front().back());
		else
			return new statement_struct(name, tree_type<token_base *>(), body, context, raw.front().back());
	}